

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptTAC.cpp
# Opt level: O0

void __thiscall MiniScript::Context::StoreValue(Context *this,Value *lhs,Value *value)

{
  int tempNum;
  bool bVar1;
  anon_union_8_3_2f476f46_for_data *msg;
  String *pSVar2;
  String local_178;
  RuntimeException local_168;
  Value local_138;
  Value local_128;
  Value local_118;
  undefined1 local_108 [8];
  Value index;
  String local_b8;
  RuntimeException local_a8;
  undefined1 local_78 [8];
  Value seq;
  SeqElemStorage *seqElem;
  Value local_50 [2];
  Value local_30;
  Value *local_20;
  Value *value_local;
  Value *lhs_local;
  Context *this_local;
  
  local_20 = value;
  value_local = lhs;
  lhs_local = (Value *)this;
  if (lhs->type == Temp) {
    tempNum = (lhs->data).tempNum;
    Value::Value(&local_30,value);
    SetTemp(this,tempNum,&local_30);
    Value::~Value(&local_30);
  }
  else if (lhs->type == Var) {
    Value::GetString(local_50);
    Value::Value((Value *)&seqElem,value);
    SetVar(this,(String *)local_50,(Value *)&seqElem);
    Value::~Value((Value *)&seqElem);
    String::~String((String *)local_50);
  }
  else if (lhs->type == SeqElem) {
    seq.data = lhs->data;
    Value::Val((Value *)local_78,(Context *)(seq.data.ref + 1),(ValueDict *)this);
    bVar1 = Value::IsNull((Value *)local_78);
    if (bVar1) {
      String::String(&local_b8,"can\'t set indexed element of null");
      pSVar2 = &local_b8;
      RuntimeException::RuntimeException(&local_a8,pSVar2);
      RuntimeException::raise(&local_a8,(int)pSVar2);
      RuntimeException::~RuntimeException(&local_a8);
      String::~String(&local_b8);
    }
    bVar1 = Value::CanSetElem((Value *)local_78);
    if (!bVar1) {
      String::String((String *)&index.data,"can\'t set an indexed element in this type");
      msg = &index.data;
      RuntimeException::RuntimeException((RuntimeException *)&stack0xffffffffffffff18,(String *)msg)
      ;
      RuntimeException::raise((RuntimeException *)&stack0xffffffffffffff18,(int)msg);
      RuntimeException::~RuntimeException((RuntimeException *)&stack0xffffffffffffff18);
      String::~String((String *)&index.data);
    }
    Value::Value((Value *)local_108,(Value *)(seq.data.ref + 2));
    if (((local_108[0] == Var) || (local_108[0] == SeqElem)) || (local_108[0] == Temp)) {
      Value::Val(&local_118,(Context *)local_108,(ValueDict *)this);
      Value::operator=((Value *)local_108,&local_118);
      Value::~Value(&local_118);
    }
    Value::Value(&local_128,(Value *)local_108);
    Value::Value(&local_138,value);
    Value::SetElem((Value *)local_78,&local_128,&local_138);
    Value::~Value(&local_138);
    Value::~Value(&local_128);
    Value::~Value((Value *)local_108);
    Value::~Value((Value *)local_78);
  }
  else {
    bVar1 = Value::IsNull(lhs);
    if (!bVar1) {
      pSVar2 = &local_178;
      String::String(pSVar2,"not an lvalue");
      RuntimeException::RuntimeException(&local_168,pSVar2);
      RuntimeException::raise(&local_168,(int)pSVar2);
      RuntimeException::~RuntimeException(&local_168);
      String::~String(&local_178);
    }
  }
  return;
}

Assistant:

void Context::StoreValue(Value lhs, Value value) {
//		std::cout << "Storing into " << lhs.ToString().c_str() << ": " << value.ToString().c_str() << std::endl;
		if (lhs.type == ValueType::Temp) {
			SetTemp(lhs.data.tempNum, value);
		} else if (lhs.type == ValueType::Var) {
			SetVar(lhs.GetString(), value);
		} else if (lhs.type == ValueType::SeqElem) {
			SeqElemStorage *seqElem = (SeqElemStorage*)(lhs.data.ref);
			Value seq = seqElem->sequence.Val(this);
			if (seq.IsNull()) RuntimeException("can't set indexed element of null").raise();
			if (not seq.CanSetElem()) RuntimeException("can't set an indexed element in this type").raise();
			Value index = seqElem->index;
			if (index.type == ValueType::Var or index.type == ValueType::SeqElem or
				index.type == ValueType::Temp) index = index.Val(this);
			seq.SetElem(index, value);
		} else {
			if (!lhs.IsNull()) RuntimeException("not an lvalue").raise();
		}
	}